

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O2

void __thiscall
VectorSUnitTest_emplace_Test::VectorSUnitTest_emplace_Test(VectorSUnitTest_emplace_Test *this)

{
  VectorSUnitTest::VectorSUnitTest(&this->super_VectorSUnitTest);
  (this->super_VectorSUnitTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_0016a3d0;
  return;
}

Assistant:

TEST_F(VectorSUnitTest, emplace)
{
    vector_s<Rect, 6> v{ {1u,1u}, {2u,2u}, {3u,3u}, {4u,4u} };
    EXPECT_EQ(Rect(1u, 1u), v[0]);
    EXPECT_EQ(Rect(2u, 2u), v[1]);
    EXPECT_EQ(Rect(3u, 3u), v[2]);
    EXPECT_EQ(Rect(4u, 4u), v[3]);
    EXPECT_EQ(4u, v.size());

    const auto it = v.emplace(v.begin()+1, 10u, 10u);
    EXPECT_EQ(Rect(10u, 10u), *it);
    EXPECT_EQ(5u, v.size());
    EXPECT_EQ(Rect(1u, 1u), v[0]);
    EXPECT_EQ(Rect(10u, 10u), v[1]);
    EXPECT_EQ(Rect(2u, 2u), v[2]);
    EXPECT_EQ(Rect(3u, 3u), v[3]);
    EXPECT_EQ(Rect(4u, 4u), v[4]);
}